

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCryptoProvider.cc
# Opt level: O0

void QPDFCryptoProvider::registerImpl(string *name,provider_fn *f)

{
  provider_fn *name_00;
  QPDFCryptoProvider *this;
  function<std::shared_ptr<QPDFCryptoImpl>_()> local_38;
  provider_fn *local_18;
  provider_fn *f_local;
  string *name_local;
  
  local_18 = f;
  f_local = (provider_fn *)name;
  this = getInstance();
  name_00 = f_local;
  std::function<std::shared_ptr<QPDFCryptoImpl>_()>::function(&local_38,f);
  registerImpl_internal(this,(string *)name_00,&local_38);
  std::function<std::shared_ptr<QPDFCryptoImpl>_()>::~function(&local_38);
  return;
}

Assistant:

void
QPDFCryptoProvider::registerImpl(std::string const& name, provider_fn f)
{
    getInstance().registerImpl_internal(name, std::move(f));
}